

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O1

void ERR_clear_error(void)

{
  undefined8 *puVar1;
  ERR_STATE *pEVar2;
  long lVar3;
  
  pEVar2 = err_get_state();
  if (pEVar2 != (ERR_STATE *)0x0) {
    lVar3 = 8;
    do {
      free(*(void **)((long)&pEVar2->errors[0].file + lVar3));
      puVar1 = (undefined8 *)((long)pEVar2->errors + lVar3 + -8);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)&pEVar2->errors[0].data + lVar3) = 0;
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x188);
    free(pEVar2->to_free);
    pEVar2->top = 0;
    pEVar2->bottom = 0;
    pEVar2->to_free = (void *)0x0;
  }
  return;
}

Assistant:

void ERR_clear_error(void) {
  ERR_STATE *const state = err_get_state();
  unsigned i;

  if (state == NULL) {
    return;
  }

  for (i = 0; i < ERR_NUM_ERRORS; i++) {
    err_clear(&state->errors[i]);
  }
  free(state->to_free);
  state->to_free = NULL;

  state->top = state->bottom = 0;
}